

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

void __thiscall
S2Builder::SnapEdge(S2Builder *this,InputEdgeId e,vector<int,_std::allocator<int>_> *chain)

{
  S2Point *a1;
  pointer pVVar1;
  pointer piVar2;
  iterator iVar3;
  int *piVar4;
  int iVar5;
  Excluded EVar6;
  int iVar7;
  pointer piVar8;
  ostream *poVar9;
  bool bVar10;
  uint uVar11;
  char *pcVar12;
  S2Point *x;
  long lVar13;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *paVar14;
  int *piVar15;
  pointer pVVar16;
  ulong uVar17;
  pointer ppVar18;
  bool bVar19;
  SiteId site_id;
  S2Point b;
  S2Point a;
  S1ChordAngle ac;
  S1ChordAngle bc;
  int local_b0;
  int local_ac;
  S2Point local_a8;
  pointer local_88;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *local_80;
  S2Point local_78;
  long local_60;
  pointer local_58;
  pointer local_50;
  int *local_48;
  S1ChordAngle local_40;
  S1ChordAngle local_38;
  
  piVar8 = (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar8) {
    (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar8;
  }
  lVar13 = (long)e;
  ppVar18 = (this->input_edges_).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start + lVar13;
  if (this->snapping_needed_ == false) {
    iVar3._M_current =
         (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar3._M_current ==
        (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)chain,iVar3,&ppVar18->first);
    }
    else {
      *iVar3._M_current = ppVar18->first;
      (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar3._M_current + 1;
    }
    iVar3._M_current =
         (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar3._M_current ==
        (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)chain,iVar3,&ppVar18->second);
      return;
    }
    *iVar3._M_current = ppVar18->second;
    (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = iVar3._M_current + 1;
  }
  else {
    pVVar16 = (this->input_vertices_).
              super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_58 = (this->edge_sites_).
               super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_60 = lVar13 * 0x10;
    local_80 = &local_58[lVar13].super_compact_array_base<int,_std::allocator<int>_>.field_7;
    paVar14 = local_80;
    if (local_58[lVar13].super_compact_array_base<int,_std::allocator<int>_>.is_inlined_ == false) {
      paVar14 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)
                local_58[lVar13].super_compact_array_base<int,_std::allocator<int>_>.field_7.
                pointer_;
    }
    a1 = pVVar16 + ppVar18->second;
    uVar11 = *(uint *)&local_58[lVar13].super_compact_array_base<int,_std::allocator<int>_> &
             0xffffff;
    local_88 = ppVar18;
    if (uVar11 != 0) {
      pVVar16 = pVVar16 + ppVar18->first;
      local_48 = (int *)((long)paVar14 + (ulong)uVar11 * 4);
      local_50 = pVVar16;
LAB_001ad4a0:
      local_b0 = *(int *)paVar14;
      x = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start + local_b0;
      iVar5 = s2pred::CompareEdgeDistance
                        (x,pVVar16,a1,(S1ChordAngle)(this->edge_snap_radius_ca_).length2_);
      if (iVar5 < 1) {
        piVar8 = (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start != piVar8) {
          bVar10 = true;
LAB_001ad4e8:
          pVVar1 = (this->sites_).
                   super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_a8.c_[2] = pVVar1[piVar8[-1]].c_[2];
          pVVar1 = pVVar1 + piVar8[-1];
          local_a8.c_[0] = pVVar1->c_[0];
          local_a8.c_[1] = pVVar1->c_[1];
          S1ChordAngle::S1ChordAngle(&local_38,&local_a8,x);
          if (local_38.length2_ < (this->max_adjacent_site_separation_ca_).length2_) {
            EVar6 = s2pred::GetVoronoiSiteExclusion
                              (&local_a8,x,pVVar16,a1,
                               (S1ChordAngle)(this->edge_snap_radius_ca_).length2_);
            if (EVar6 == FIRST) {
              bVar19 = false;
              goto LAB_001ad580;
            }
            if (EVar6 == SECOND) {
              bVar10 = false;
              goto LAB_001ad57d;
            }
            if (EVar6 != NEITHER) {
              S2LogMessage::S2LogMessage
                        ((S2LogMessage *)&local_78,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                         ,0x3ee,kFatal,(ostream *)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_78.c_[1],
                         "Check failed: (s2pred::Excluded::NEITHER) == (result) ",0x36);
              goto LAB_001ad8d7;
            }
            piVar8 = (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            if (4 < (ulong)((long)piVar8 -
                           (long)(chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start)) {
              iVar5 = piVar8[-2];
              pVVar1 = (this->sites_).
                       super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              local_78.c_[2] = pVVar1[iVar5].c_[2];
              pVVar1 = pVVar1 + iVar5;
              local_78.c_[0] = pVVar1->c_[0];
              local_78.c_[1] = pVVar1->c_[1];
              S1ChordAngle::S1ChordAngle(&local_40,&local_78,x);
              bVar19 = true;
              if (local_40.length2_ < (this->max_adjacent_site_separation_ca_).length2_) {
                iVar5 = s2pred::Sign(pVVar16,a1,&local_a8);
                iVar7 = s2pred::Sign(&local_78,&local_a8,x);
                pVVar16 = local_50;
                local_ac = iVar5;
                if (iVar7 != iVar5) {
                  iVar5 = s2pred::EdgeCircumcenterSign(local_50,a1,&local_78,&local_a8,x);
                  bVar19 = iVar5 != local_ac;
                }
              }
              goto LAB_001ad580;
            }
          }
LAB_001ad57d:
          bVar19 = true;
LAB_001ad580:
          if (bVar19) goto LAB_001ad652;
          piVar2 = (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish + -1;
          (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = piVar8;
          if (piVar2 == piVar8) goto LAB_001ad652;
          goto LAB_001ad4e8;
        }
        goto LAB_001ad659;
      }
      goto LAB_001ad680;
    }
LAB_001ad692:
    if ((chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start ==
        (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                 ,0x409,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_a8.c_[1],"Check failed: !chain->empty() ",0x1e);
LAB_001ad8d7:
      abort();
    }
    pcVar12 = (local_58->super_compact_array_base<int,_std::allocator<int>_>).unused_padding_ +
              local_60 + -5;
    if ((char)*(uint *)(pcVar12 + 4) == '\0') {
      local_80 = *(anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 **)
                  (pcVar12 + 8);
    }
    uVar11 = *(uint *)pcVar12;
    if ((uVar11 & 0xffffff) != 0) {
      uVar17 = 0;
      do {
        pVVar16 = (this->sites_).
                  super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar5 = s2pred::CompareDistances
                          (a1,pVVar16 + (chain->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_finish[-1],
                           pVVar16 + *(int *)((long)local_80 + uVar17));
        if (0 < iVar5) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)&local_a8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                     ,0x40e,kError,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_a8.c_[1],"Snapping invariant broken!",0x1a);
          S2LogMessage::~S2LogMessage((S2LogMessage *)&local_a8);
        }
        uVar17 = uVar17 + 4;
      } while ((uVar11 & 0xffffff) << 2 != uVar17);
    }
    if (s2builder_verbose != false) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
      ppVar18 = local_88;
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,local_88->first);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,ppVar18->second);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"): ",3);
      piVar4 = (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar15 = (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start; piVar15 != piVar4; piVar15 = piVar15 + 1) {
        poVar9 = (ostream *)std::ostream::operator<<(&std::cout,*piVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
    }
  }
  return;
LAB_001ad652:
  if (bVar10) {
LAB_001ad659:
    iVar3._M_current =
         (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar3._M_current ==
        (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)chain,iVar3,&local_b0);
    }
    else {
      *iVar3._M_current = local_b0;
      (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar3._M_current + 1;
    }
  }
LAB_001ad680:
  paVar14 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)
            ((long)paVar14 + 4);
  if (paVar14 ==
      (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)local_48)
  goto LAB_001ad692;
  goto LAB_001ad4a0;
}

Assistant:

void S2Builder::SnapEdge(InputEdgeId e, vector<SiteId>* chain) const {
  chain->clear();
  const InputEdge& edge = input_edges_[e];
  if (!snapping_needed_) {
    chain->push_back(edge.first);
    chain->push_back(edge.second);
    return;
  }

  const S2Point& x = input_vertices_[edge.first];
  const S2Point& y = input_vertices_[edge.second];

  // Optimization: if there is only one nearby site, return.
  // Optimization: if there are exactly two nearby sites, and one is close
  // enough to each vertex, then return.

  // Now iterate through the sites.  We keep track of the sequence of sites
  // that are visited.
  const auto& candidates = edge_sites_[e];
  for (SiteId site_id : candidates) {
    const S2Point& c = sites_[site_id];
    // Skip any sites that are too far away.  (There will be some of these,
    // because we also keep track of "sites to avoid".)  Note that some sites
    // may be close enough to the line containing the edge, but not to the
    // edge itself, so we can just use the dot product with the edge normal.
    if (s2pred::CompareEdgeDistance(c, x, y, edge_snap_radius_ca_) > 0) {
      continue;
    }
    // Check whether the new site C excludes the previous site B.  If so,
    // repeat with the previous site, and so on.
    bool add_site_c = true;
    for (; !chain->empty(); chain->pop_back()) {
      S2Point b = sites_[chain->back()];

      // First, check whether B and C are so far apart that their clipped
      // Voronoi regions can't intersect.
      S1ChordAngle bc(b, c);
      if (bc >= max_adjacent_site_separation_ca_) break;

      // Otherwise, we want to check whether site C prevents the Voronoi
      // region of B from intersecting XY, or vice versa.  This can be
      // determined by computing the "coverage interval" (the segment of XY
      // intersected by the coverage disc of radius snap_radius) for each
      // site.  If the coverage interval of one site contains the coverage
      // interval of the other, then the contained site can be excluded.
      s2pred::Excluded result = s2pred::GetVoronoiSiteExclusion(
          b, c, x, y, edge_snap_radius_ca_);
      if (result == s2pred::Excluded::FIRST) continue;  // Site B excluded by C
      if (result == s2pred::Excluded::SECOND) {
        add_site_c = false;  // Site C is excluded by B.
        break;
      }
      S2_DCHECK_EQ(s2pred::Excluded::NEITHER, result);

      // Otherwise check whether the previous site A is close enough to B and
      // C that it might further clip the Voronoi region of B.
      if (chain->size() < 2) break;
      S2Point a = sites_[chain->end()[-2]];
      S1ChordAngle ac(a, c);
      if (ac >= max_adjacent_site_separation_ca_) break;

      // If triangles ABC and XYB have the same orientation, the circumcenter
      // Z of ABC is guaranteed to be on the same side of XY as B.
      int xyb = s2pred::Sign(x, y, b);
      if (s2pred::Sign(a, b, c) == xyb) {
        break;  // The circumcenter is on the same side as B but further away.
      }
      // Other possible optimizations:
      //  - if AB > max_adjacent_site_separation_ca_ then keep B.
      //  - if d(B, XY) < 0.5 * min(AB, BC) then keep B.

      // If the circumcenter of ABC is on the same side of XY as B, then B is
      // excluded by A and C combined.  Otherwise B is needed and we can exit.
      if (s2pred::EdgeCircumcenterSign(x, y, a, b, c) != xyb) break;
    }
    if (add_site_c) {
      chain->push_back(site_id);
    }
  }
  S2_DCHECK(!chain->empty());
  if (google::DEBUG_MODE) {
    for (SiteId site_id : candidates) {
      if (s2pred::CompareDistances(y, sites_[chain->back()],
                                   sites_[site_id]) > 0) {
        S2_LOG(ERROR) << "Snapping invariant broken!";
      }
    }
  }
  if (s2builder_verbose) {
    std::cout << "(" << edge.first << "," << edge.second << "): ";
    for (SiteId id : *chain) std::cout << id << " ";
    std::cout << std::endl;
  }
}